

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::updateGeomArray(QToolBarLayout *this)

{
  Representation *pRVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Orientation OVar11;
  int iVar12;
  Orientation OVar13;
  QSizePolicy QVar14;
  int iVar15;
  int iVar16;
  QWidget *pQVar17;
  QStyle *pQVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  long lVar22;
  pointer pQVar23;
  ulong uVar24;
  byte bVar25;
  int iVar26;
  QSize *pQVar27;
  QSize *pQVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  long in_FS_OFFSET;
  bool bVar32;
  QMargins QVar33;
  QArrayDataPointer<QLayoutStruct> local_b8;
  QStyleOptionToolBar opt;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->dirty == true) {
    pQVar17 = QLayout::parentWidget(&this->super_QLayout);
    pQVar17 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&pQVar17->super_QObject)->
               super_QWidget;
    if (pQVar17 != (QWidget *)0x0) {
      pQVar18 = QWidget::style(pQVar17);
      opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionToolBar::QStyleOptionToolBar(&opt);
      (**(code **)(*(long *)pQVar17 + 0x1a0))(pQVar17,&opt);
      bVar6 = movable(this);
      iVar29 = 0;
      iVar8 = 0;
      if (bVar6) {
        iVar8 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0x35,&opt,pQVar17);
      }
      QVar33 = QLayout::contentsMargins(&this->super_QLayout);
      iVar9 = (**(code **)(*(long *)&this->super_QLayout + 0x60))(this);
      iVar10 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0x39,&opt,pQVar17);
      OVar11 = QToolBar::orientation((QToolBar *)pQVar17);
      bVar6 = OVar11 != Horizontal;
      bVar32 = OVar11 != Vertical;
      (this->hint).wd = 0;
      (this->hint).ht = 0;
      (this->minSize).wd = 0;
      (this->minSize).ht = 0;
      iVar12 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0x35,&opt,pQVar17);
      (&(this->minSize).wd)[bVar32].m_i = iVar12;
      iVar12 = (**(code **)(*(long *)pQVar18 + 0xe0))(pQVar18,0x35,&opt,pQVar17);
      (&(this->hint).wd)[bVar32].m_i = iVar12;
      this->expanding = false;
      this->empty = false;
      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)&local_b8,(this->items).d.size + 1);
      lVar31 = 0;
      for (uVar24 = 0; uVar24 < (ulong)(this->items).d.size; uVar24 = uVar24 + 1) {
        plVar4 = *(long **)((long)(this->items).d.ptr + lVar31);
        uVar19 = (**(code **)(*plVar4 + 0x20))(plVar4);
        uVar20 = (**(code **)(*plVar4 + 0x18))(plVar4);
        uVar21 = (**(code **)(*plVar4 + 0x10))(plVar4);
        OVar13 = (**(code **)(*plVar4 + 0x28))(plVar4);
        bVar7 = (bool)(**(code **)(*plVar4 + 0x40))(plVar4);
        this->expanding = (bool)(this->expanding | (OVar13 & OVar11) != 0);
        lVar22 = (**(code **)(*plVar4 + 0x68))(plVar4);
        if (lVar22 != 0) {
          pQVar17 = (QWidget *)(**(code **)(*plVar4 + 0x68))(plVar4);
          QVar14 = QWidget::sizePolicy(pQVar17);
          if (((uint)QVar14.field_0 >> 0x11 & 1) != 0) {
            this->expandFlag = true;
          }
        }
        iVar12 = (int)((ulong)uVar20 >> 0x20);
        iVar15 = (int)uVar20;
        if (bVar7 == false) {
          iVar16 = iVar9;
          if (iVar29 == 0) {
            iVar16 = iVar12;
            if (OVar11 == Horizontal) {
              iVar16 = iVar15;
            }
            pRVar1 = &(this->minSize).wd + bVar6;
            pRVar1->m_i = pRVar1->m_i + iVar16;
            iVar16 = 0;
          }
          iVar26 = (int)(uVar21 >> 0x20);
          if (OVar11 == Vertical) {
            iVar26 = (int)uVar21;
          }
          iVar30 = iVar12;
          if (OVar11 == Vertical) {
            iVar30 = iVar15;
          }
          pQVar27 = (QSize *)&(this->hint).ht;
          if (OVar11 == Vertical) {
            pQVar27 = &this->hint;
          }
          pQVar28 = (QSize *)&(this->minSize).ht;
          if (OVar11 == Vertical) {
            pQVar28 = &this->minSize;
          }
          iVar2 = (pQVar28->wd).m_i;
          if (iVar30 < iVar2) {
            iVar30 = iVar2;
          }
          (&(this->minSize).wd)[bVar32].m_i = iVar30;
          uVar5 = uVar21 >> 0x20;
          if (OVar11 == Horizontal) {
            uVar5 = uVar21;
          }
          iVar30 = (int)uVar5;
          pRVar1 = &(this->hint).wd + bVar6;
          pRVar1->m_i = pRVar1->m_i + iVar16 + iVar30;
          iVar16 = (pQVar27->wd).m_i;
          if (iVar26 < iVar16) {
            iVar26 = iVar16;
          }
          (&(this->hint).wd)[bVar32].m_i = iVar26;
          iVar29 = iVar29 + 1;
        }
        else {
          uVar5 = uVar21 >> 0x20;
          if (OVar11 == Horizontal) {
            uVar5 = uVar21;
          }
          iVar30 = (int)uVar5;
        }
        pQVar23 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
        (&pQVar23->sizeHint)[lVar31] = iVar30;
        pQVar23 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
        iVar16 = (int)((ulong)uVar19 >> 0x20);
        if (OVar11 == Horizontal) {
          iVar16 = (int)uVar19;
        }
        (&pQVar23->maximumSize)[lVar31] = iVar16;
        if (OVar11 == Horizontal) {
          iVar12 = iVar15;
        }
        pQVar23 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
        (&pQVar23->minimumSize)[lVar31] = iVar12;
        pQVar23 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
        (&pQVar23->expansive)[lVar31 * 4] = (OVar13 & OVar11) != 0;
        pQVar17 = (QWidget *)(**(code **)(*plVar4 + 0x68))(plVar4);
        QVar14 = QWidget::sizePolicy(pQVar17);
        bVar25 = QVar14.field_0._1_1_;
        if (OVar11 == Horizontal) {
          bVar25 = QVar14.field_0._0_1_;
        }
        pQVar23 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
        (&pQVar23->stretch)[lVar31] = (uint)bVar25;
        pQVar23 = QList<QLayoutStruct>::data((QList<QLayoutStruct> *)&local_b8);
        (&pQVar23->empty)[lVar31 * 4] = bVar7;
        lVar31 = lVar31 + 8;
      }
      QArrayDataPointer<QLayoutStruct>::operator=(&(this->geomArray).d,&local_b8);
      this->empty = iVar29 == 0;
      pRVar1 = &(this->minSize).wd + bVar6;
      pRVar1->m_i = pRVar1->m_i + iVar8;
      iVar29 = QVar33.m_right.m_i.m_i + QVar33.m_left.m_i.m_i;
      (this->minSize).wd.m_i = (this->minSize).wd.m_i + iVar29;
      iVar12 = QVar33.m_bottom.m_i.m_i + QVar33.m_top.m_i.m_i;
      pRVar1 = &(this->minSize).ht;
      pRVar1->m_i = pRVar1->m_i + iVar12;
      if (1 < (ulong)(this->items).d.size) {
        pRVar1 = &(this->minSize).wd + bVar6;
        pRVar1->m_i = pRVar1->m_i + iVar10 + iVar9;
      }
      pRVar1 = &(this->hint).wd + bVar6;
      pRVar1->m_i = pRVar1->m_i + iVar8;
      (this->hint).wd.m_i = (this->hint).wd.m_i + iVar29;
      pRVar1 = &(this->hint).ht;
      pRVar1->m_i = pRVar1->m_i + iVar12;
      this->dirty = false;
      QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(&local_b8);
      QStyleOption::~QStyleOption(&opt.super_QStyleOption);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::updateGeomArray() const
{
    if (!dirty)
        return;

    QToolBarLayout *that = const_cast<QToolBarLayout*>(this);

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    that->minSize = QSize(0, 0);
    that->hint = QSize(0, 0);
    rperp(o, that->minSize) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);
    rperp(o, that->hint) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);

    that->expanding = false;
    that->empty = false;

    QList<QLayoutStruct> a(items.size() + 1); // + 1 for the stretch

    int count = 0;
    for (int i = 0; i < items.size(); ++i) {
        QToolBarItem *item = items.at(i);

        QSize max = item->maximumSize();
        QSize min = item->minimumSize();
        QSize hint = item->sizeHint();
        Qt::Orientations exp = item->expandingDirections();
        bool empty = item->isEmpty();

        that->expanding = expanding || exp & o;


        if (item->widget()) {
            if ((item->widget()->sizePolicy().horizontalPolicy() & QSizePolicy::ExpandFlag)) {
                that->expandFlag = true;
            }
        }

        if (!empty) {
            if (count == 0) // the minimum size only displays one widget
                rpick(o, that->minSize) += pick(o, min);
            int s = perp(o, minSize);
            rperp(o, that->minSize) = qMax(s, perp(o, min));

            //we only add spacing before item (ie never before the first one)
            rpick(o, that->hint) += (count == 0 ? 0 : spacing) + pick(o, hint);
            s = perp(o, that->hint);
            rperp(o, that->hint) = qMax(s, perp(o, hint));
            ++count;
        }

        a[i].sizeHint = pick(o, hint);
        a[i].maximumSize = pick(o, max);
        a[i].minimumSize = pick(o, min);
        a[i].expansive = exp & o;
        if (o == Qt::Horizontal)
            a[i].stretch = item->widget()->sizePolicy().horizontalStretch();
        else
            a[i].stretch = item->widget()->sizePolicy().verticalStretch();
        a[i].empty = empty;
    }

    that->geomArray = a;
    that->empty = count == 0;

    rpick(o, that->minSize) += handleExtent;
    that->minSize += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    if (items.size() > 1)
        rpick(o, that->minSize) += spacing + extensionExtent;

    rpick(o, that->hint) += handleExtent;
    that->hint += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    that->dirty = false;
}